

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cc
# Opt level: O2

Entry * __thiscall mcc::SymbolTable::GetField(SymbolTable *this,Type *type,string *field)

{
  element_type *peVar1;
  Entry *pEVar2;
  __type _Var3;
  mapped_type *pmVar4;
  Entry **ppEVar5;
  
  if ((type->type_ != T_NONE) &&
     (peVar1 = (type->name).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar1 != (element_type *)0x0)) {
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->types_,&peVar1->identifier_);
    ppEVar5 = &pmVar4->next;
    while (pEVar2 = *ppEVar5, pEVar2 != (Entry *)0x0) {
      _Var3 = std::operator==(&pEVar2->name,field);
      if (_Var3) {
        return pEVar2;
      }
      ppEVar5 = &pEVar2->next;
    }
  }
  return (Entry *)0x0;
}

Assistant:

Entry* SymbolTable::GetField(const Type& type, const std::string& field) {
  if (type.type_ == TokenType::T_NONE || type.name == nullptr) return nullptr;
  Entry* fields = types_[type.name->String()].next;
  while (fields != nullptr) {
    if (fields->name == field) {
      return fields;
    }
    fields = fields->next;
  }

  return nullptr;
}